

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenInitializer.cxx
# Opt level: O2

bool __thiscall cmQtAutoGenInitializer::InitScanFiles(cmQtAutoGenInitializer *this)

{
  unordered_map<cmSourceFile_*,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>,_std::hash<cmSourceFile_*>,_std::equal_to<cmSourceFile_*>,_std::allocator<std::pair<cmSourceFile_*const,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>_>_>
  *this_00;
  unordered_map<cmSourceFile_*,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>,_std::hash<cmSourceFile_*>,_std::equal_to<cmSourceFile_*>,_std::allocator<std::pair<cmSourceFile_*const,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>_>_>
  *this_01;
  uint uVar1;
  cmMakefile *this_02;
  cmSourceFile *this_03;
  _Hash_node_base filename;
  pointer pbVar2;
  pointer ppMVar3;
  MUFile *text;
  cmGeneratorTarget *this_04;
  pointer pQVar4;
  pointer pQVar5;
  key_type *pkVar6;
  pointer puVar7;
  __type _Var8;
  bool bVar9;
  bool bVar10;
  byte bVar11;
  FileFormat FVar12;
  string *psVar13;
  string *psVar14;
  char *pcVar15;
  cmake *pcVar16;
  iterator iVar17;
  undefined7 extraout_var;
  long lVar18;
  mapped_type *this_05;
  pointer ppcVar19;
  ulong uVar20;
  byte bVar21;
  undefined8 extraout_RDX;
  unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>
  *eMuf_1;
  pointer muf;
  pointer pQVar23;
  pointer pbVar24;
  pointer ppcVar25;
  key_type *__rhs;
  undefined1 rcc;
  undefined8 in_R8;
  pointer pQVar26;
  pointer ppMVar27;
  iterator __begin3;
  string pathError;
  vector<std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>,_std::allocator<std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>_>
  extraHeaders;
  __node_base *local_310;
  string opts;
  cmSourceFile *sf;
  MUFileHandle eMuf;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> srcFiles;
  anon_class_8_1_8991fb9c addMUFile;
  Qrc qrc;
  anon_class_32_4_0bc3998a makeMUFile;
  string SKIP_AUTOGEN_str;
  string ui_str;
  string qrc_str;
  string AUTORCC_OPTIONS_str;
  string AUTOUIC_OPTIONS_str;
  string SKIP_AUTORCC_str;
  string SKIP_AUTOUIC_str;
  string SKIP_AUTOMOC_str;
  PolicyID id;
  undefined8 uVar22;
  
  this_02 = this->Target->Target->Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&SKIP_AUTOGEN_str,"SKIP_AUTOGEN",(allocator<char> *)&qrc);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&SKIP_AUTOMOC_str,"SKIP_AUTOMOC",(allocator<char> *)&qrc);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&SKIP_AUTOUIC_str,"SKIP_AUTOUIC",(allocator<char> *)&qrc);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&SKIP_AUTORCC_str,"SKIP_AUTORCC",(allocator<char> *)&qrc);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&AUTOUIC_OPTIONS_str,"AUTOUIC_OPTIONS",(allocator<char> *)&qrc);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&AUTORCC_OPTIONS_str,"AUTORCC_OPTIONS",(allocator<char> *)&qrc);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&qrc_str,"qrc",(allocator<char> *)&qrc);
  std::__cxx11::string::string<std::allocator<char>>((string *)&ui_str,"ui",(allocator<char> *)&qrc)
  ;
  srcFiles.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  srcFiles.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  srcFiles.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  addMUFile.this = this;
  makeMUFile.SKIP_AUTOGEN_str = &SKIP_AUTOGEN_str;
  makeMUFile.this = this;
  makeMUFile.SKIP_AUTOMOC_str = &SKIP_AUTOMOC_str;
  makeMUFile.SKIP_AUTOUIC_str = &SKIP_AUTOUIC_str;
  cmGeneratorTarget::GetConfigCommonSourceFiles(this->Target,&srcFiles);
  ppcVar25 = srcFiles.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
  for (ppcVar19 = srcFiles.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                  _M_impl.super__Vector_impl_data._M_start; uVar22 = 1, ppcVar19 != ppcVar25;
      ppcVar19 = ppcVar19 + 1) {
    this_03 = *ppcVar19;
    pathError._M_dataplus._M_p = (pointer)&pathError.field_2;
    pathError._M_string_length = 0;
    pathError.field_2._M_local_buf[0] = '\0';
    psVar13 = cmSourceFile::GetFullPath(this_03,&pathError);
    if ((pathError._M_string_length == 0) && (psVar13->_M_string_length != 0)) {
      psVar14 = cmSourceFile::GetExtension_abi_cxx11_(this_03);
      if (((this->Moc).super_GenVarsT.Enabled != false) ||
         (((this->Uic).super_GenVarsT.Enabled & 1U) != 0)) {
        FVar12 = cmSystemTools::GetFileFormat(psVar14);
        if (FVar12 == CXX_FILE_FORMAT) {
          InitScanFiles::anon_class_32_4_0bc3998a::operator()
                    ((anon_class_32_4_0bc3998a *)&qrc,(cmSourceFile *)&makeMUFile,(string *)this_03,
                     SUB81(psVar13,0));
          InitScanFiles::anon_class_8_1_8991fb9c::operator()(&addMUFile,(MUFileHandle *)&qrc,false);
        }
        else {
          if (FVar12 != HEADER_FILE_FORMAT) goto LAB_001f9f27;
          InitScanFiles::anon_class_32_4_0bc3998a::operator()
                    ((anon_class_32_4_0bc3998a *)&qrc,(cmSourceFile *)&makeMUFile,(string *)this_03,
                     SUB81(psVar13,0));
          InitScanFiles::anon_class_8_1_8991fb9c::operator()(&addMUFile,(MUFileHandle *)&qrc,true);
        }
        std::
        unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>
        ::~unique_ptr((unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>
                       *)&qrc);
        in_R8 = uVar22;
      }
LAB_001f9f27:
      if (((((this->Rcc).super_GenVarsT.Enabled == true) &&
           (_Var8 = std::operator==(psVar14,&qrc_str), _Var8)) &&
          (bVar9 = cmSourceFile::GetPropertyAsBool(this_03,&SKIP_AUTOGEN_str), !bVar9)) &&
         (bVar9 = cmSourceFile::GetPropertyAsBool(this_03,&SKIP_AUTORCC_str), !bVar9)) {
        qrc.LockFile._M_dataplus._M_p = (pointer)&qrc.LockFile.field_2;
        qrc.LockFile._M_string_length = 0;
        qrc.LockFile.field_2._M_local_buf[0] = '\0';
        qrc.QrcFile._M_dataplus._M_p = (pointer)&qrc.QrcFile.field_2;
        qrc.QrcFile._M_string_length = 0;
        qrc.QrcFile.field_2._M_local_buf[0] = '\0';
        qrc.QrcName._M_dataplus._M_p = (pointer)&qrc.QrcName.field_2;
        qrc.QrcName._M_string_length = 0;
        qrc.QrcName.field_2._M_local_buf[0] = '\0';
        qrc.PathChecksum._M_dataplus._M_p = (pointer)&qrc.PathChecksum.field_2;
        qrc.PathChecksum._M_string_length = 0;
        qrc.PathChecksum.field_2._M_local_buf[0] = '\0';
        qrc.InfoFile._M_dataplus._M_p = (pointer)&qrc.InfoFile.field_2;
        qrc.InfoFile._M_string_length = 0;
        qrc.InfoFile.field_2._M_local_buf[0] = '\0';
        qrc.SettingsFile._M_dataplus._M_p = (pointer)&qrc.SettingsFile.field_2;
        qrc.SettingsFile._M_string_length = 0;
        qrc.SettingsFile.field_2._M_local_buf[0] = '\0';
        qrc.ConfigSettingsFile._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        qrc.ConfigSettingsFile._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)0x0;
        qrc.ConfigSettingsFile._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &qrc.ConfigSettingsFile._M_t._M_impl.super__Rb_tree_header._M_header;
        qrc.ConfigSettingsFile._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        qrc.RccFile._M_dataplus._M_p = (pointer)&qrc.RccFile.field_2;
        qrc.RccFile._M_string_length = 0;
        qrc.RccFile.field_2._M_local_buf[0] = '\0';
        qrc.Generated = false;
        qrc.Unique = false;
        qrc.Resources.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        qrc.Resources.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        qrc.Options.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        qrc.Resources.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        qrc.Options.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        qrc.Options.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        qrc.ConfigSettingsFile._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             qrc.ConfigSettingsFile._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        cmsys::SystemTools::GetRealPath(&opts,psVar13,(string *)0x0);
        std::__cxx11::string::operator=((string *)&qrc.QrcFile,(string *)&opts);
        std::__cxx11::string::~string((string *)&opts);
        cmsys::SystemTools::GetFilenameWithoutLastExtension(&opts,&qrc.QrcFile);
        std::__cxx11::string::operator=((string *)&qrc.QrcName,(string *)&opts);
        std::__cxx11::string::~string((string *)&opts);
        qrc.Generated = this_03->IsGenerated;
        pcVar15 = cmSourceFile::GetSafeProperty(this_03,&AUTORCC_OPTIONS_str);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&opts,pcVar15,(allocator<char> *)&extraHeaders);
        if (opts._M_string_length != 0) {
          cmSystemTools::ExpandListArgument(&opts,&qrc.Options,false);
        }
        std::__cxx11::string::~string((string *)&opts);
        std::vector<cmQtAutoGenInitializer::Qrc,_std::allocator<cmQtAutoGenInitializer::Qrc>_>::
        emplace_back<cmQtAutoGenInitializer::Qrc>(&(this->Rcc).Qrcs,&qrc);
        Qrc::~Qrc(&qrc);
      }
    }
    std::__cxx11::string::~string((string *)&pathError);
  }
  std::_Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::~_Vector_base
            (&srcFiles.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>);
  cmGeneratorTarget::ClearSourcesCache(this->Target);
  bVar9 = (this->Moc).super_GenVarsT.Enabled;
  uVar20 = CONCAT71((int7)((ulong)ppcVar19 >> 8),bVar9);
  bVar11 = (this->Uic).super_GenVarsT.Enabled;
  if (((bVar11 | bVar9) & 1) != 0) {
    extraHeaders.
    super__Vector_base<std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>,_std::allocator<std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    extraHeaders.
    super__Vector_base<std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>,_std::allocator<std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    extraHeaders.
    super__Vector_base<std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>,_std::allocator<std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    std::
    vector<std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>,_std::allocator<std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>_>
    ::reserve(&extraHeaders,(this->AutogenTarget).Sources._M_h._M_element_count * 2);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&qrc,"",(allocator<char> *)&pathError);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&qrc.QrcFile,"_p",(allocator<char> *)&opts);
    pcVar16 = cmMakefile::GetCMakeInstance(this_02);
    psVar13 = (string *)&(this->AutogenTarget).Sources._M_h._M_before_begin;
    local_310 = (__node_base *)psVar13;
    while (puVar7 = extraHeaders.
                    super__Vector_base<std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>,_std::allocator<std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish, local_310 = local_310->_M_nxt,
          local_310 != (__node_base *)0x0) {
      filename._M_nxt = *(_Hash_node_base **)(local_310 + 2);
      if ((*(char *)((long)&((string *)(filename._M_nxt + 4))->_M_string_length + 3) != '\0') ||
         (*(char *)((long)&((string *)(filename._M_nxt + 4))->_M_string_length + 4) == '\x01')) {
        cmQtAutoGen::SubDirPrefix(&pathError,(string *)filename._M_nxt);
        cmsys::SystemTools::GetFilenameWithoutLastExtension(&opts,(string *)filename._M_nxt);
        std::__cxx11::string::append((string *)&pathError);
        std::__cxx11::string::~string((string *)&opts);
        for (lVar18 = 0; lVar18 != 0x40; lVar18 = lVar18 + 0x20) {
          std::operator+(&opts,&pathError,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&qrc.LockFile._M_dataplus._M_p + lVar18));
          pbVar2 = (pcVar16->HeaderFileExtensions).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          for (pbVar24 = (pcVar16->HeaderFileExtensions).
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start; pbVar24 != pbVar2;
              pbVar24 = pbVar24 + 1) {
            std::__cxx11::string::string((string *)&srcFiles,(string *)&opts);
            bVar9 = SUB81((string *)&srcFiles,0);
            std::__cxx11::string::push_back(bVar9);
            std::__cxx11::string::append((string *)&srcFiles);
            sf = cmMakefile::GetSource(this_02,(string *)&srcFiles,Known);
            if (sf == (cmSourceFile *)0x0) {
              bVar10 = cmsys::SystemTools::FileExists((string *)&srcFiles);
              if (bVar10) {
                psVar13 = (string *)0x0;
                sf = cmMakefile::CreateSource(this_02,(string *)&srcFiles,false,Known);
              }
              if (sf != (cmSourceFile *)0x0) goto LAB_001fa397;
            }
            else {
              iVar17 = std::
                       _Hashtable<cmSourceFile_*,_std::pair<cmSourceFile_*const,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>,_std::allocator<std::pair<cmSourceFile_*const,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>_>,_std::__detail::_Select1st,_std::equal_to<cmSourceFile_*>,_std::hash<cmSourceFile_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                       ::find(&(this->AutogenTarget).Headers._M_h,&sf);
              if (iVar17.
                  super__Node_iterator_base<std::pair<cmSourceFile_*const,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>,_false>
                  ._M_cur == (__node_type *)0x0) {
                if (sf->IsGenerated == false) {
                  bVar10 = cmsys::SystemTools::FileExists((string *)&srcFiles);
                  psVar13 = (string *)(CONCAT71(extraout_var,bVar10) & 0xffffffff);
                  if (((byte)psVar13 & sf != (cmSourceFile *)0x0) == 0) goto LAB_001fa3f9;
                }
LAB_001fa397:
                in_R8 = 1;
                psVar13 = (string *)&srcFiles;
                InitScanFiles::anon_class_32_4_0bc3998a::operator()
                          ((anon_class_32_4_0bc3998a *)&eMuf,(cmSourceFile *)&makeMUFile,
                           (string *)sf,bVar9);
                if (*(char *)((long)&((string *)(filename._M_nxt + 4))->_M_string_length + 3) ==
                    '\0') {
                  *(undefined1 *)
                   ((long)eMuf._M_t.
                          super___uniq_ptr_impl<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_cmQtAutoGenInitializer::MUFile_*,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>
                          .super__Head_base<0UL,_cmQtAutoGenInitializer::MUFile_*,_false>.
                          _M_head_impl + 0x2b) = 0;
                }
                if (*(char *)((long)&((string *)(filename._M_nxt + 4))->_M_string_length + 4) ==
                    '\0') {
                  *(undefined1 *)
                   ((long)eMuf._M_t.
                          super___uniq_ptr_impl<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_cmQtAutoGenInitializer::MUFile_*,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>
                          .super__Head_base<0UL,_cmQtAutoGenInitializer::MUFile_*,_false>.
                          _M_head_impl + 0x2c) = 0;
                }
                std::
                vector<std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>,std::allocator<std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>>
                ::
                emplace_back<std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>
                          ((vector<std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>,std::allocator<std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>>
                            *)&extraHeaders,&eMuf);
                std::
                unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>
                ::~unique_ptr(&eMuf);
              }
            }
LAB_001fa3f9:
            std::__cxx11::string::~string((string *)&srcFiles);
          }
          std::__cxx11::string::~string((string *)&opts);
        }
        std::__cxx11::string::~string((string *)&pathError);
      }
    }
    for (muf = extraHeaders.
               super__Vector_base<std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>,_std::allocator<std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start; muf != puVar7; muf = muf + 1) {
      InitScanFiles::anon_class_8_1_8991fb9c::operator()(&addMUFile,muf,true);
    }
    std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
    ::~array((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
              *)&qrc);
    std::
    vector<std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>,_std::allocator<std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>_>
    ::~vector(&extraHeaders);
    uVar20 = CONCAT71((int7)((ulong)psVar13 >> 8),(this->Moc).super_GenVarsT.Enabled);
    bVar11 = (this->Uic).super_GenVarsT.Enabled;
  }
  bVar21 = (byte)(uVar20 & 0xffffffff) | bVar11;
  uVar22 = CONCAT71((int7)((uVar20 & 0xffffffff) >> 8),bVar21);
  id = (PolicyID)uVar22;
  if ((bVar21 & 1) != 0) {
    ppcVar19 = (this_02->SourceFiles).
               super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
               super__Vector_impl_data._M_finish;
    this_00 = &(this->AutogenTarget).Sources;
    this_01 = &(this->AutogenTarget).Headers;
    for (ppcVar25 = (this_02->SourceFiles).
                    super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
                    super__Vector_impl_data._M_start; id = (PolicyID)uVar22, ppcVar25 != ppcVar19;
        ppcVar25 = ppcVar25 + 1) {
      extraHeaders.
      super__Vector_base<std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>,_std::allocator<std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)*ppcVar25;
      qrc.LockFile._M_dataplus._M_p = (pointer)&qrc.LockFile.field_2;
      qrc.LockFile._M_string_length = 0;
      qrc.LockFile.field_2._M_local_buf[0] = '\0';
      psVar13 = cmSourceFile::GetFullPath
                          ((cmSourceFile *)
                           extraHeaders.
                           super__Vector_base<std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>,_std::allocator<std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start,&qrc.LockFile);
      if ((qrc.LockFile._M_string_length == 0) && (psVar13->_M_string_length != 0)) {
        psVar14 = cmSourceFile::GetExtension_abi_cxx11_
                            ((cmSourceFile *)
                             extraHeaders.
                             super__Vector_base<std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>,_std::allocator<std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start);
        FVar12 = cmSystemTools::GetFileFormat(psVar14);
        if (FVar12 == CXX_FILE_FORMAT) {
          iVar17 = std::
                   _Hashtable<cmSourceFile_*,_std::pair<cmSourceFile_*const,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>,_std::allocator<std::pair<cmSourceFile_*const,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>_>,_std::__detail::_Select1st,_std::equal_to<cmSourceFile_*>,_std::hash<cmSourceFile_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   ::find(&this_00->_M_h,(key_type *)&extraHeaders);
          if (iVar17.
              super__Node_iterator_base<std::pair<cmSourceFile_*const,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>,_false>
              ._M_cur == (__node_type *)0x0) {
            in_R8 = 0;
            InitScanFiles::anon_class_32_4_0bc3998a::operator()
                      ((anon_class_32_4_0bc3998a *)&pathError,(cmSourceFile *)&makeMUFile,
                       (string *)
                       extraHeaders.
                       super__Vector_base<std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>,_std::allocator<std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,SUB81(psVar13,0));
            if ((pathError._M_dataplus._M_p[0x29] != '\0') ||
               (pathError._M_dataplus._M_p[0x2a] == '\x01')) {
              std::
              _Hashtable<cmSourceFile*,std::pair<cmSourceFile*const,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>,std::allocator<std::pair<cmSourceFile*const,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>>,std::__detail::_Select1st,std::equal_to<cmSourceFile*>,std::hash<cmSourceFile*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              ::
              _M_emplace<cmSourceFile*&,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>
                        ((_Hashtable<cmSourceFile*,std::pair<cmSourceFile*const,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>,std::allocator<std::pair<cmSourceFile*const,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>>,std::__detail::_Select1st,std::equal_to<cmSourceFile*>,std::hash<cmSourceFile*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                          *)this_00,&extraHeaders,&pathError);
            }
LAB_001fa629:
            std::
            unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>
            ::~unique_ptr((unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>
                           *)&pathError);
          }
        }
        else if (FVar12 == HEADER_FILE_FORMAT) {
          iVar17 = std::
                   _Hashtable<cmSourceFile_*,_std::pair<cmSourceFile_*const,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>,_std::allocator<std::pair<cmSourceFile_*const,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>_>,_std::__detail::_Select1st,_std::equal_to<cmSourceFile_*>,_std::hash<cmSourceFile_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   ::find(&this_01->_M_h,(key_type *)&extraHeaders);
          if (iVar17.
              super__Node_iterator_base<std::pair<cmSourceFile_*const,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>,_false>
              ._M_cur == (__node_type *)0x0) {
            in_R8 = 0;
            InitScanFiles::anon_class_32_4_0bc3998a::operator()
                      ((anon_class_32_4_0bc3998a *)&pathError,(cmSourceFile *)&makeMUFile,
                       (string *)
                       extraHeaders.
                       super__Vector_base<std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>,_std::allocator<std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,SUB81(psVar13,0));
            if ((pathError._M_dataplus._M_p[0x29] != '\0') ||
               (pathError._M_dataplus._M_p[0x2a] == '\x01')) {
              std::
              _Hashtable<cmSourceFile*,std::pair<cmSourceFile*const,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>,std::allocator<std::pair<cmSourceFile*const,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>>,std::__detail::_Select1st,std::equal_to<cmSourceFile*>,std::hash<cmSourceFile*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              ::
              _M_emplace<cmSourceFile*&,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>
                        ((_Hashtable<cmSourceFile*,std::pair<cmSourceFile*const,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>,std::allocator<std::pair<cmSourceFile*const,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>>,std::__detail::_Select1st,std::equal_to<cmSourceFile*>,std::hash<cmSourceFile*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                          *)this_01,&extraHeaders,&pathError);
            }
            goto LAB_001fa629;
          }
        }
        else if (((this->Uic).super_GenVarsT.Enabled == true) &&
                (_Var8 = std::operator==(psVar14,&ui_str), _Var8)) {
          cmsys::SystemTools::GetRealPath(&pathError,psVar13,(string *)0x0);
          bVar9 = cmSourceFile::GetPropertyAsBool
                            ((cmSourceFile *)
                             extraHeaders.
                             super__Vector_base<std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>,_std::allocator<std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start,&SKIP_AUTOGEN_str);
          if ((bVar9) ||
             (bVar9 = cmSourceFile::GetPropertyAsBool
                                ((cmSourceFile *)
                                 extraHeaders.
                                 super__Vector_base<std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>,_std::allocator<std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start,&SKIP_AUTOUIC_str), bVar9
             )) {
            std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::_M_insert_unique<std::__cxx11::string>
                      ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        *)&(this->Uic).SkipUi,&pathError);
          }
          else {
            pcVar15 = cmSourceFile::GetSafeProperty
                                ((cmSourceFile *)
                                 extraHeaders.
                                 super__Vector_base<std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>,_std::allocator<std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start,&AUTOUIC_OPTIONS_str);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&opts,pcVar15,(allocator<char> *)&srcFiles);
            if (opts._M_string_length != 0) {
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<std::__cxx11::string>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                         &(this->Uic).FileFiles,&pathError);
              srcFiles.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              srcFiles.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              srcFiles.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              cmSystemTools::ExpandListArgument
                        (&opts,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)&srcFiles,false);
              std::
              vector<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::allocator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
              ::emplace_back<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                        ((vector<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::allocator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                          *)&(this->Uic).FileOptions,
                         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&srcFiles);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&srcFiles);
            }
            std::__cxx11::string::~string((string *)&opts);
          }
          std::__cxx11::string::~string((string *)&pathError);
        }
      }
      std::__cxx11::string::~string((string *)&qrc);
      uVar22 = extraout_RDX;
    }
    uVar20 = (ulong)(this->Moc).super_GenVarsT.Enabled;
    bVar11 = (this->Uic).super_GenVarsT.Enabled;
  }
  if (((uVar20 & 1) != 0) || ((bVar11 & 1) != 0)) {
    ppMVar27 = (this->AutogenTarget).FilesGenerated.
               super__Vector_base<cmQtAutoGenInitializer::MUFile_*,_std::allocator<cmQtAutoGenInitializer::MUFile_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    ppMVar3 = (this->AutogenTarget).FilesGenerated.
              super__Vector_base<cmQtAutoGenInitializer::MUFile_*,_std::allocator<cmQtAutoGenInitializer::MUFile_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (ppMVar27 != ppMVar3) {
      if (this->CMP0071Accept == true) {
        for (; ppMVar27 != ppMVar3; ppMVar27 = ppMVar27 + 1) {
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string_const&>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)&(this->AutogenTarget).DependFiles,&(*ppMVar27)->RealPath);
        }
      }
      else if (this->CMP0071Warn == true) {
        qrc.LockFile._M_dataplus._M_p = (pointer)&qrc.LockFile.field_2;
        qrc.LockFile._M_string_length = 0;
        qrc.LockFile.field_2._M_local_buf[0] = '\0';
        cmPolicies::GetPolicyWarning_abi_cxx11_(&pathError,(cmPolicies *)0x47,id);
        std::__cxx11::string::append((string *)&qrc);
        std::__cxx11::string::~string((string *)&pathError);
        std::__cxx11::string::push_back((char)&qrc);
        pathError._M_dataplus._M_p = (pointer)&pathError.field_2;
        pathError._M_string_length = 0;
        pathError.field_2._M_local_buf[0] = '\0';
        if (((this->Moc).super_GenVarsT.Enabled == true) ||
           ((this->Uic).super_GenVarsT.Enabled != false)) {
          std::__cxx11::string::assign((char *)&pathError);
        }
        std::__cxx11::string::append((char *)&qrc);
        ppMVar3 = (this->AutogenTarget).FilesGenerated.
                  super__Vector_base<cmQtAutoGenInitializer::MUFile_*,_std::allocator<cmQtAutoGenInitializer::MUFile_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        for (ppMVar27 = (this->AutogenTarget).FilesGenerated.
                        super__Vector_base<cmQtAutoGenInitializer::MUFile_*,_std::allocator<cmQtAutoGenInitializer::MUFile_*>_>
                        ._M_impl.super__Vector_impl_data._M_start; rcc = (undefined1)in_R8,
            ppMVar27 != ppMVar3; ppMVar27 = ppMVar27 + 1) {
          text = *ppMVar27;
          std::__cxx11::string::append((char *)&qrc);
          cmQtAutoGen::Quoted(&opts,&text->RealPath);
          std::__cxx11::string::append((string *)&qrc);
          std::__cxx11::string::~string((string *)&opts);
          std::__cxx11::string::push_back((char)&qrc);
        }
        std::__cxx11::string::append((char *)&qrc);
        cmQtAutoGen::Tools_abi_cxx11_
                  (&opts,(cmQtAutoGen *)(ulong)(this->Moc).super_GenVarsT.Enabled,
                   (this->Uic).super_GenVarsT.Enabled,false,(bool)rcc);
        std::__cxx11::string::append((string *)&qrc);
        std::__cxx11::string::~string((string *)&opts);
        std::__cxx11::string::append((char *)&qrc);
        std::__cxx11::string::append((string *)&qrc);
        std::__cxx11::string::append((char *)&qrc);
        std::__cxx11::string::append((string *)&qrc);
        std::__cxx11::string::append((char *)&qrc);
        cmMakefile::IssueMessage(this_02,AUTHOR_WARNING,&qrc.LockFile);
        std::__cxx11::string::~string((string *)&pathError);
        std::__cxx11::string::~string((string *)&qrc);
      }
    }
  }
  bVar9 = true;
  if ((this->Rcc).Qrcs.
      super__Vector_base<cmQtAutoGenInitializer::Qrc,_std::allocator<cmQtAutoGenInitializer::Qrc>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      (this->Rcc).Qrcs.
      super__Vector_base<cmQtAutoGenInitializer::Qrc,_std::allocator<cmQtAutoGenInitializer::Qrc>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    uVar1 = (this->QtVersion).Major;
    extraHeaders.
    super__Vector_base<std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>,_std::allocator<std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    extraHeaders.
    super__Vector_base<std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>,_std::allocator<std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    extraHeaders.
    super__Vector_base<std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>,_std::allocator<std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    this_04 = this->Target;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&pathError,"AUTORCC_OPTIONS",(allocator<char> *)&opts);
    pcVar15 = cmGeneratorTarget::GetSafeProperty(this_04,&pathError);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&qrc,pcVar15,(allocator<char> *)&srcFiles);
    cmSystemTools::ExpandListArgument
              (&qrc.LockFile,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&extraHeaders,false);
    std::__cxx11::string::~string((string *)&qrc);
    std::__cxx11::string::~string((string *)&pathError);
    pQVar4 = (this->Rcc).Qrcs.
             super__Vector_base<cmQtAutoGenInitializer::Qrc,_std::allocator<cmQtAutoGenInitializer::Qrc>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pQVar23 = (this->Rcc).Qrcs.
                   super__Vector_base<cmQtAutoGenInitializer::Qrc,_std::allocator<cmQtAutoGenInitializer::Qrc>_>
                   ._M_impl.super__Vector_impl_data._M_start; pQVar23 != pQVar4;
        pQVar23 = pQVar23 + 1) {
      pQVar23->Unique = true;
      pQVar5 = (this->Rcc).Qrcs.
               super__Vector_base<cmQtAutoGenInitializer::Qrc,_std::allocator<cmQtAutoGenInitializer::Qrc>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (pQVar26 = (this->Rcc).Qrcs.
                     super__Vector_base<cmQtAutoGenInitializer::Qrc,_std::allocator<cmQtAutoGenInitializer::Qrc>_>
                     ._M_impl.super__Vector_impl_data._M_start; pQVar26 != pQVar5;
          pQVar26 = pQVar26 + 1) {
        if ((pQVar26 != pQVar23) &&
           (_Var8 = std::operator==(&pQVar23->QrcName,&pQVar26->QrcName), _Var8)) {
          pQVar23->Unique = false;
          break;
        }
      }
    }
    cmFilePathChecksum::cmFilePathChecksum((cmFilePathChecksum *)&qrc,this_02);
    pQVar4 = (this->Rcc).Qrcs.
             super__Vector_base<cmQtAutoGenInitializer::Qrc,_std::allocator<cmQtAutoGenInitializer::Qrc>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pQVar23 = (this->Rcc).Qrcs.
                   super__Vector_base<cmQtAutoGenInitializer::Qrc,_std::allocator<cmQtAutoGenInitializer::Qrc>_>
                   ._M_impl.super__Vector_impl_data._M_start; pQVar23 != pQVar4;
        pQVar23 = pQVar23 + 1) {
      cmFilePathChecksum::getPart(&pathError,(cmFilePathChecksum *)&qrc,&pQVar23->QrcFile,10);
      std::__cxx11::string::operator=((string *)&pQVar23->PathChecksum,(string *)&pathError);
      std::__cxx11::string::~string((string *)&pathError);
      std::operator+(&pathError,&(this->Dir).Build,"/");
      std::__cxx11::string::append((string *)&pathError);
      std::__cxx11::string::append((char *)&pathError);
      std::__cxx11::string::append((string *)&pathError);
      std::__cxx11::string::append((char *)&pathError);
      std::__cxx11::string::operator=((string *)&pQVar23->RccFile,(string *)&pathError);
      std::__cxx11::string::~string((string *)&pathError);
      std::__cxx11::string::string((string *)&pathError,(string *)&this->Dir);
      std::__cxx11::string::append((char *)&pathError);
      std::__cxx11::string::append((string *)&pathError);
      if (pQVar23->Unique == false) {
        std::__cxx11::string::append((string *)&pathError);
      }
      std::__cxx11::string::_M_assign((string *)pQVar23);
      std::__cxx11::string::append((char *)pQVar23);
      std::__cxx11::string::_M_assign((string *)&pQVar23->InfoFile);
      std::__cxx11::string::append((char *)&pQVar23->InfoFile);
      psVar13 = &pQVar23->SettingsFile;
      std::__cxx11::string::_M_assign((string *)psVar13);
      std::__cxx11::string::append((char *)psVar13);
      if (this->MultiConfig == true) {
        pkVar6 = (this->ConfigsList).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (__rhs = (this->ConfigsList).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; __rhs != pkVar6; __rhs = __rhs + 1)
        {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &srcFiles,"_",__rhs);
          cmQtAutoGen::AppendFilenameSuffix
                    (&opts,psVar13,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&srcFiles)
          ;
          this_05 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator[](&pQVar23->ConfigSettingsFile,__rhs);
          std::__cxx11::string::operator=((string *)this_05,(string *)&opts);
          std::__cxx11::string::~string((string *)&opts);
          std::__cxx11::string::~string((string *)&srcFiles);
        }
      }
      std::__cxx11::string::~string((string *)&pathError);
    }
    std::
    array<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_4UL>
    ::~array((array<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_4UL>
              *)&qrc);
    pQVar4 = (this->Rcc).Qrcs.
             super__Vector_base<cmQtAutoGenInitializer::Qrc,_std::allocator<cmQtAutoGenInitializer::Qrc>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pQVar23 = (this->Rcc).Qrcs.
                   super__Vector_base<cmQtAutoGenInitializer::Qrc,_std::allocator<cmQtAutoGenInitializer::Qrc>_>
                   ._M_impl.super__Vector_impl_data._M_start; pQVar23 != pQVar4;
        pQVar23 = pQVar23 + 1) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&pathError,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&extraHeaders);
      std::__cxx11::string::string((string *)&qrc,(string *)&pQVar23->QrcName);
      opts._M_dataplus._M_p._0_1_ = 0x2d;
      srcFiles.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)CONCAT71(srcFiles.
                             super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                             _M_impl.super__Vector_impl_data._M_start._1_7_,0x5f);
      std::replace<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
                ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )qrc.LockFile._M_dataplus._M_p,
                 (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )(qrc.LockFile._M_dataplus._M_p + qrc.LockFile._M_string_length),(char *)&opts,
                 (char *)&srcFiles);
      if (pQVar23->Unique == false) {
        std::__cxx11::string::append((char *)&qrc);
        std::__cxx11::string::append((string *)&qrc);
      }
      opts._M_dataplus._M_p = (pointer)0x0;
      opts._M_string_length = 0;
      opts.field_2._M_allocated_capacity = 0;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const(&)[6]>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&opts,
                 (char (*) [6])0x493d46);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&opts,
                 &qrc.LockFile);
      cmQtAutoGen::RccMergeOptions
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&pathError,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&opts,4 < uVar1);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&opts);
      std::__cxx11::string::~string((string *)&qrc);
      cmQtAutoGen::RccMergeOptions
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&pathError,&pQVar23->Options,4 < uVar1);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_M_move_assign(&pQVar23->Options,&pathError);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&pathError);
    }
    pQVar4 = (this->Rcc).Qrcs.
             super__Vector_base<cmQtAutoGenInitializer::Qrc,_std::allocator<cmQtAutoGenInitializer::Qrc>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pQVar23 = (this->Rcc).Qrcs.
                   super__Vector_base<cmQtAutoGenInitializer::Qrc,_std::allocator<cmQtAutoGenInitializer::Qrc>_>
                   ._M_impl.super__Vector_impl_data._M_start; pQVar23 != pQVar4;
        pQVar23 = pQVar23 + 1) {
      if (pQVar23->Generated == false) {
        qrc.LockFile._M_dataplus._M_p = (pointer)&qrc.LockFile.field_2;
        qrc.LockFile._M_string_length = 0;
        qrc.LockFile.field_2._M_local_buf[0] = '\0';
        bVar9 = RccListInputs(this,&pQVar23->QrcFile,&pQVar23->Resources,&qrc.LockFile);
        if (!bVar9) {
          cmSystemTools::Error(&qrc.LockFile);
          std::__cxx11::string::~string((string *)&qrc);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&extraHeaders);
          bVar9 = false;
          goto LAB_001faeef;
        }
        std::__cxx11::string::~string((string *)&qrc);
      }
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&extraHeaders);
    bVar9 = true;
  }
LAB_001faeef:
  std::__cxx11::string::~string((string *)&ui_str);
  std::__cxx11::string::~string((string *)&qrc_str);
  std::__cxx11::string::~string((string *)&AUTORCC_OPTIONS_str);
  std::__cxx11::string::~string((string *)&AUTOUIC_OPTIONS_str);
  std::__cxx11::string::~string((string *)&SKIP_AUTORCC_str);
  std::__cxx11::string::~string((string *)&SKIP_AUTOUIC_str);
  std::__cxx11::string::~string((string *)&SKIP_AUTOMOC_str);
  std::__cxx11::string::~string((string *)&SKIP_AUTOGEN_str);
  return bVar9;
}

Assistant:

bool cmQtAutoGenInitializer::InitScanFiles()
{
  cmMakefile* makefile = this->Target->Target->GetMakefile();

  // String constants
  std::string const SKIP_AUTOGEN_str = "SKIP_AUTOGEN";
  std::string const SKIP_AUTOMOC_str = "SKIP_AUTOMOC";
  std::string const SKIP_AUTOUIC_str = "SKIP_AUTOUIC";
  std::string const SKIP_AUTORCC_str = "SKIP_AUTORCC";
  std::string const AUTOUIC_OPTIONS_str = "AUTOUIC_OPTIONS";
  std::string const AUTORCC_OPTIONS_str = "AUTORCC_OPTIONS";
  std::string const qrc_str = "qrc";
  std::string const ui_str = "ui";

  auto makeMUFile = [&](cmSourceFile* sf, std::string const& fullPath,
                        bool muIt) -> MUFileHandle {
    MUFileHandle muf = cm::make_unique<MUFile>();
    muf->RealPath = cmSystemTools::GetRealPath(fullPath);
    muf->SF = sf;
    muf->Generated = sf->GetIsGenerated();
    bool const skipAutogen = sf->GetPropertyAsBool(SKIP_AUTOGEN_str);
    muf->SkipMoc = this->Moc.Enabled &&
      (skipAutogen || sf->GetPropertyAsBool(SKIP_AUTOMOC_str));
    muf->SkipUic = this->Uic.Enabled &&
      (skipAutogen || sf->GetPropertyAsBool(SKIP_AUTOUIC_str));
    if (muIt) {
      muf->MocIt = this->Moc.Enabled && !muf->SkipMoc;
      muf->UicIt = this->Uic.Enabled && !muf->SkipUic;
    }
    return muf;
  };

  auto addMUFile = [&](MUFileHandle&& muf, bool isHeader) {
    if ((muf->MocIt || muf->UicIt) && muf->Generated) {
      this->AutogenTarget.FilesGenerated.emplace_back(muf.get());
    }
    if (isHeader) {
      this->AutogenTarget.Headers.emplace(muf->SF, std::move(muf));
    } else {
      this->AutogenTarget.Sources.emplace(muf->SF, std::move(muf));
    }
  };

  // Scan through target files
  {
    // Scan through target files
    std::vector<cmSourceFile*> srcFiles;
    this->Target->GetConfigCommonSourceFiles(srcFiles);
    for (cmSourceFile* sf : srcFiles) {
      // sf->GetExtension() is only valid after sf->GetFullPath() ...
      // Since we're iterating over source files that might be not in the
      // target we need to check for path errors (not existing files).
      std::string pathError;
      std::string const& fullPath = sf->GetFullPath(&pathError);
      if (!pathError.empty() || fullPath.empty()) {
        continue;
      }
      std::string const& ext = sf->GetExtension();

      // Register files that will be scanned by moc or uic
      if (this->MocOrUicEnabled()) {
        switch (cmSystemTools::GetFileFormat(ext)) {
          case cmSystemTools::HEADER_FILE_FORMAT:
            addMUFile(makeMUFile(sf, fullPath, true), true);
            break;
          case cmSystemTools::CXX_FILE_FORMAT:
            addMUFile(makeMUFile(sf, fullPath, true), false);
            break;
          default:
            break;
        }
      }

      // Register rcc enabled files
      if (this->Rcc.Enabled) {
        if ((ext == qrc_str) && !sf->GetPropertyAsBool(SKIP_AUTOGEN_str) &&
            !sf->GetPropertyAsBool(SKIP_AUTORCC_str)) {
          // Register qrc file
          Qrc qrc;
          qrc.QrcFile = cmSystemTools::GetRealPath(fullPath);
          qrc.QrcName =
            cmSystemTools::GetFilenameWithoutLastExtension(qrc.QrcFile);
          qrc.Generated = sf->GetIsGenerated();
          // RCC options
          {
            std::string const opts = sf->GetSafeProperty(AUTORCC_OPTIONS_str);
            if (!opts.empty()) {
              cmSystemTools::ExpandListArgument(opts, qrc.Options);
            }
          }
          this->Rcc.Qrcs.push_back(std::move(qrc));
        }
      }
    }
  }
  // cmGeneratorTarget::GetConfigCommonSourceFiles computes the target's
  // sources meta data cache. Clear it so that OBJECT library targets that
  // are AUTOGEN initialized after this target get their added
  // mocs_compilation.cpp source acknowledged by this target.
  this->Target->ClearSourcesCache();

  // For source files find additional headers and private headers
  if (this->MocOrUicEnabled()) {
    std::vector<MUFileHandle> extraHeaders;
    extraHeaders.reserve(this->AutogenTarget.Sources.size() * 2);
    // Header search suffixes and extensions
    std::array<std::string, 2> const suffixes{ { "", "_p" } };
    auto const& exts = makefile->GetCMakeInstance()->GetHeaderExtensions();
    // Scan through sources
    for (auto const& pair : this->AutogenTarget.Sources) {
      MUFile const& muf = *pair.second;
      if (muf.MocIt || muf.UicIt) {
        // Search for the default header file and a private header
        std::string const& realPath = muf.RealPath;
        std::string basePath = cmQtAutoGen::SubDirPrefix(realPath);
        basePath += cmSystemTools::GetFilenameWithoutLastExtension(realPath);
        for (auto const& suffix : suffixes) {
          std::string const suffixedPath = basePath + suffix;
          for (auto const& ext : exts) {
            std::string fullPath = suffixedPath;
            fullPath += '.';
            fullPath += ext;

            auto constexpr locationKind = cmSourceFileLocationKind::Known;
            cmSourceFile* sf = makefile->GetSource(fullPath, locationKind);
            if (sf != nullptr) {
              // Check if we know about this header already
              if (this->AutogenTarget.Headers.find(sf) !=
                  this->AutogenTarget.Headers.end()) {
                continue;
              }
              // We only accept not-GENERATED files that do exist.
              if (!sf->GetIsGenerated() &&
                  !cmSystemTools::FileExists(fullPath)) {
                continue;
              }
            } else if (cmSystemTools::FileExists(fullPath)) {
              // Create a new source file for the existing file
              sf = makefile->CreateSource(fullPath, false, locationKind);
            }

            if (sf != nullptr) {
              auto eMuf = makeMUFile(sf, fullPath, true);
              // Ony process moc/uic when the parent is processed as well
              if (!muf.MocIt) {
                eMuf->MocIt = false;
              }
              if (!muf.UicIt) {
                eMuf->UicIt = false;
              }
              extraHeaders.emplace_back(std::move(eMuf));
            }
          }
        }
      }
    }
    // Move generated files to main headers list
    for (auto& eMuf : extraHeaders) {
      addMUFile(std::move(eMuf), true);
    }
  }

  // Scan through all source files in the makefile to extract moc and uic
  // parameters.  Historically we support non target source file parameters.
  // The reason is that their file names might be discovered from source files
  // at generation time.
  if (this->MocOrUicEnabled()) {
    for (cmSourceFile* sf : makefile->GetSourceFiles()) {
      // sf->GetExtension() is only valid after sf->GetFullPath() ...
      // Since we're iterating over source files that might be not in the
      // target we need to check for path errors (not existing files).
      std::string pathError;
      std::string const& fullPath = sf->GetFullPath(&pathError);
      if (!pathError.empty() || fullPath.empty()) {
        continue;
      }
      std::string const& ext = sf->GetExtension();

      auto const fileFormat = cmSystemTools::GetFileFormat(ext);
      if (fileFormat == cmSystemTools::HEADER_FILE_FORMAT) {
        if (this->AutogenTarget.Headers.find(sf) ==
            this->AutogenTarget.Headers.end()) {
          auto muf = makeMUFile(sf, fullPath, false);
          if (muf->SkipMoc || muf->SkipUic) {
            this->AutogenTarget.Headers.emplace(sf, std::move(muf));
          }
        }
      } else if (fileFormat == cmSystemTools::CXX_FILE_FORMAT) {
        if (this->AutogenTarget.Sources.find(sf) ==
            this->AutogenTarget.Sources.end()) {
          auto muf = makeMUFile(sf, fullPath, false);
          if (muf->SkipMoc || muf->SkipUic) {
            this->AutogenTarget.Sources.emplace(sf, std::move(muf));
          }
        }
      } else if (this->Uic.Enabled && (ext == ui_str)) {
        // .ui file
        std::string realPath = cmSystemTools::GetRealPath(fullPath);
        bool const skipAutogen = sf->GetPropertyAsBool(SKIP_AUTOGEN_str);
        bool const skipUic =
          (skipAutogen || sf->GetPropertyAsBool(SKIP_AUTOUIC_str));
        if (!skipUic) {
          // Check if the .ui file has uic options
          std::string const uicOpts = sf->GetSafeProperty(AUTOUIC_OPTIONS_str);
          if (!uicOpts.empty()) {
            this->Uic.FileFiles.push_back(std::move(realPath));
            std::vector<std::string> optsVec;
            cmSystemTools::ExpandListArgument(uicOpts, optsVec);
            this->Uic.FileOptions.push_back(std::move(optsVec));
          }
        } else {
          // Register skipped .ui file
          this->Uic.SkipUi.insert(std::move(realPath));
        }
      }
    }
  }

  // Process GENERATED sources and headers
  if (this->MocOrUicEnabled() && !this->AutogenTarget.FilesGenerated.empty()) {
    if (this->CMP0071Accept) {
      // Let the autogen target depend on the GENERATED files
      for (MUFile* muf : this->AutogenTarget.FilesGenerated) {
        this->AutogenTarget.DependFiles.insert(muf->RealPath);
      }
    } else if (this->CMP0071Warn) {
      std::string msg;
      msg += cmPolicies::GetPolicyWarning(cmPolicies::CMP0071);
      msg += '\n';
      std::string property;
      if (this->Moc.Enabled && this->Uic.Enabled) {
        property = "SKIP_AUTOGEN";
      } else if (this->Moc.Enabled) {
        property = "SKIP_AUTOMOC";
      } else if (this->Uic.Enabled) {
        property = "SKIP_AUTOUIC";
      }
      msg += "For compatibility, CMake is excluding the GENERATED source "
             "file(s):\n";
      for (MUFile* muf : this->AutogenTarget.FilesGenerated) {
        msg += "  ";
        msg += Quoted(muf->RealPath);
        msg += '\n';
      }
      msg += "from processing by ";
      msg += cmQtAutoGen::Tools(this->Moc.Enabled, this->Uic.Enabled, false);
      msg += ". If any of the files should be processed, set CMP0071 to NEW. "
             "If any of the files should not be processed, "
             "explicitly exclude them by setting the source file property ";
      msg += property;
      msg += ":\n  set_property(SOURCE file.h PROPERTY ";
      msg += property;
      msg += " ON)\n";
      makefile->IssueMessage(MessageType::AUTHOR_WARNING, msg);
    }
  }

  // Process qrc files
  if (!this->Rcc.Qrcs.empty()) {
    const bool modernQt = (this->QtVersion.Major >= 5);
    // Target rcc options
    std::vector<std::string> optionsTarget;
    cmSystemTools::ExpandListArgument(
      this->Target->GetSafeProperty("AUTORCC_OPTIONS"), optionsTarget);

    // Check if file name is unique
    for (Qrc& qrc : this->Rcc.Qrcs) {
      qrc.Unique = true;
      for (Qrc const& qrc2 : this->Rcc.Qrcs) {
        if ((&qrc != &qrc2) && (qrc.QrcName == qrc2.QrcName)) {
          qrc.Unique = false;
          break;
        }
      }
    }
    // Path checksum and file names
    {
      cmFilePathChecksum const fpathCheckSum(makefile);
      for (Qrc& qrc : this->Rcc.Qrcs) {
        qrc.PathChecksum = fpathCheckSum.getPart(qrc.QrcFile);
        // RCC output file name
        {
          std::string rccFile = this->Dir.Build + "/";
          rccFile += qrc.PathChecksum;
          rccFile += "/qrc_";
          rccFile += qrc.QrcName;
          rccFile += ".cpp";
          qrc.RccFile = std::move(rccFile);
        }
        {
          std::string base = this->Dir.Info;
          base += "/RCC";
          base += qrc.QrcName;
          if (!qrc.Unique) {
            base += qrc.PathChecksum;
          }

          qrc.LockFile = base;
          qrc.LockFile += ".lock";

          qrc.InfoFile = base;
          qrc.InfoFile += "Info.cmake";

          qrc.SettingsFile = base;
          qrc.SettingsFile += "Settings.txt";

          if (this->MultiConfig) {
            for (std::string const& cfg : this->ConfigsList) {
              qrc.ConfigSettingsFile[cfg] =
                AppendFilenameSuffix(qrc.SettingsFile, "_" + cfg);
            }
          }
        }
      }
    }
    // RCC options
    for (Qrc& qrc : this->Rcc.Qrcs) {
      // Target options
      std::vector<std::string> opts = optionsTarget;
      // Merge computed "-name XYZ" option
      {
        std::string name = qrc.QrcName;
        // Replace '-' with '_'. The former is not valid for symbol names.
        std::replace(name.begin(), name.end(), '-', '_');
        if (!qrc.Unique) {
          name += "_";
          name += qrc.PathChecksum;
        }
        std::vector<std::string> nameOpts;
        nameOpts.emplace_back("-name");
        nameOpts.emplace_back(std::move(name));
        RccMergeOptions(opts, nameOpts, modernQt);
      }
      // Merge file option
      RccMergeOptions(opts, qrc.Options, modernQt);
      qrc.Options = std::move(opts);
    }
    // RCC resources
    for (Qrc& qrc : this->Rcc.Qrcs) {
      if (!qrc.Generated) {
        std::string error;
        if (!RccListInputs(qrc.QrcFile, qrc.Resources, error)) {
          cmSystemTools::Error(error);
          return false;
        }
      }
    }
  }

  return true;
}